

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M1P<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer ppVar1;
  ReturnType RVar2;
  double dVar3;
  double dVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  pointer pMVar9;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar10;
  byte bVar11;
  Matrix<double,_3,_1,_0,_3,_1> n2;
  Matrix<double,_3,_1,_0,_3,_1> n1;
  Matrix<double,_4,_4,_0,_4,_4> TV1;
  Scalar local_c60;
  Scalar local_c58;
  Scalar local_c50;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_3,_1,_0,_3,_1> dir2;
  Matrix<double,_3,_1,_0,_3,_1> dir1;
  _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_c00;
  Matrix<double,_4,_4,_0,_4,_4> TV2;
  Matrix<double,_3,_1,_0,_3,_1> w2;
  Matrix<double,_3,_1,_0,_3,_1> p2;
  Matrix<double,_3,_1,_0,_3,_1> p1;
  Matrix<double,_3,_1,_0,_3,_1> m2;
  Matrix<double,_3,_1,_0,_3,_1> m1;
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  Matrix<double,_4,_4,_0,_4,_4> sol;
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  Scalar local_928;
  Scalar local_920;
  Scalar local_918;
  Matrix<double,_3,_1,_0,_3,_1> w;
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  Matrix<double,_4,_1,_0,_4,_1> NuU;
  Matrix<double,_4,_1,_0,_4,_1> PiU;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Matrix<double,_6,_1,_0,_6,_1> lU2;
  Matrix<double,_3,_1,_0,_3,_1> local_768;
  Matrix<double,_3,_1,_0,_3,_1> local_750;
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  Matrix<double,_4,_1,_0,_4,_1> Nuu;
  Matrix<double,_4,_1,_0,_4,_1> Piu;
  Matrix<double,_6,_1,_0,_6,_1> lu2;
  Matrix<double,_6,_1,_0,_6,_1> lu1;
  Matrix<double,_6,_1,_0,_6,_1> lU1;
  Matrix<double,_4,_4,_0,_4,_4> *local_540;
  Matrix<double,_4,_4,_0,_4,_4> *local_538;
  Matrix<double,_4,_4,_0,_4,_4> *local_530;
  Matrix<double,_4,_4,_0,_4,_4> *local_528;
  Matrix<double,_4,_4,_0,_4,_4> *local_520;
  Matrix<double,_4,_4,_0,_4,_4> *local_518;
  Matrix<double,_3,_3,_0,_3,_3> V2;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_3,_1,_0,_3,_1> local_3c8;
  Matrix<double,_3,_1,_0,_3,_1> local_3a8;
  Matrix<double,_4,_1,_0,_4,_1> local_388;
  Matrix<double,_4,_1,_0,_4,_1> local_368;
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  Matrix<double,_3,_3,_0,_3,_3> V1;
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_b8;
  
  bVar11 = 0;
  if (((lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish ==
       (lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start) &&
     ((ulong)((long)(plPair->
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(plPair->
                   super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            (&Pi,&((plPair->
                   super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->first);
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            (&Nu,&((plPair->
                   super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->second);
  ppVar1 = (lCPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = *(double *)
               &(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = *(double *)
               ((long)&(ppVar1->first).first.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = *(double *)
               ((long)&(ppVar1->first).first.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = *(double *)
               ((long)&(ppVar1->first).first.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&lines1,&local_b8);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&TUL1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Pi,3);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&TUL2,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             lines1.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,3);
  RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::
          dot<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&TUL1,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)&TUL2);
  if (1e-06 <= ABS(RVar2)) {
    local_368.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_368.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_368.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_368.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
    ;
    local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
    ;
    local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
    ;
    local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
    ;
    getPredefinedTransformations1Plane3Line<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&local_c00,&local_368,&local_388,false);
    lVar8 = 0x10;
    pMVar9 = local_c00._M_impl.super__Vector_impl_data._M_finish + -1;
    pMVar10 = &TU2;
    for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0];
      pMVar9 = (pointer)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    local_c00._M_impl.super__Vector_impl_data._M_finish =
         local_c00._M_impl.super__Vector_impl_data._M_finish + -2;
    pMVar9 = local_c00._M_impl.super__Vector_impl_data._M_finish;
    pMVar10 = &TU1;
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0];
      pMVar9 = (pointer)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&TUL1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&TUL2);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&TUL2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&TuL1,&TU1,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TuL2,&TUL1,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&TuL1,&TU1,3,3);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,&TUL1,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&Tu1,&TU1,3,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_750,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)&Tu1
              );
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&TuL2,&local_750);
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&TuL2;
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tu2,&TU1,3,3)
    ;
    Eigen::
    Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TuL1,(Lhs *)&TV2,(Rhs *)&Tu2);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,&TUL1,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&TuL1,&TU2,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)&TuL2,&TUL2,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&TuL1,&TU2,3,3);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,&TUL2,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TuL2,
               (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&Tu1,&TU2,3,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_768,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)&Tu1
              );
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&TuL2,&local_768);
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&TuL2;
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&Tu2,&TU2,3,3)
    ;
    Eigen::
    Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)&TuL1,(Lhs *)&TV2,(Rhs *)&Tu2);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,&TUL2,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV1,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)lines1.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&TUL1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU1,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)(lines1.
                  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&TUL2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lU2,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&TU1;
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&Pi;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&PiU,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&TuL1);
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&TU2;
    TuL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         (double)&Nu;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&NuU,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lU1,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&dir1,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1
              );
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lU1,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&m1,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1
              );
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lU2,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&dir2,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1
              );
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lU2,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&m2,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1
              );
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&PiU,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&n1,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&TuL1
              );
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TuL1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&NuU,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&n2,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&TuL1
              );
    Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         m1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)&Tu1,PiU.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3,(StorageBaseType *)&dir1);
    TuL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TuL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
    TuL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&Tu2;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&n1,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&dir1);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&TuL1,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                          *)&TuL2,(double *)&TV1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&p1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&TuL1);
    Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
         n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    Tu2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
         m2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         n2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)&Tu1,NuU.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3,(StorageBaseType *)&dir2);
    TuL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TuL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
         Tu1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
    TuL2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         (double)&Tu2;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&n2,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&dir2);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&TuL1,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                          *)&TuL2,(double *)&TV1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&p2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&TuL1);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&Tu1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&TuL1,&Tu1,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1,&p1);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&Tu2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&TuL1);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)&TuL1,&Tu2,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1,&p2);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&TuL1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&TuL2);
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&TuL2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&TV1);
    local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = p1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
    ;
    local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = p1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
    ;
    local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = p1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
    ;
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&TV1,&local_3a8);
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&TV1;
    Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV2,&TuL1,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV2,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                *)&sol);
    local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = p2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
    ;
    local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = p2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
    ;
    local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = p2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
    ;
    getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&TV1,&local_3c8);
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&TV1;
    Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV2,&TuL2,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TV2,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                *)&sol);
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&TuL1;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (double)&lU1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lu1,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&TV1);
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (double)&lU2;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&TuL2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&lu2,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&TV1);
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&Tu1;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (double)&PiU;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&Piu,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&TV1);
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&Tu2;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         (double)&NuU;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&Nuu,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lu1,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (&dir1,(Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lu1,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (&m1,(Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lu2,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (&dir2,(Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&lu2,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (&m2,(Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Piu,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
              (&n1,(Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *)&TV1);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TV1,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Nuu,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>>
              (&n2,(Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *)&TV1);
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&dir1,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&n1);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)&TV2,(double *)&sol,(StorageBaseType *)&n1);
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&dir1;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::normalized(&w,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                     *)&TV1);
    dVar3 = atan2(w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1],w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0]);
    V1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         cos(dVar3);
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&V1;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0
    ;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         4.94065645841247e-324;
    TV1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         4.94065645841247e-324;
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         sin(dVar3);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&TV1,
                        (Scalar *)&TV2);
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.0
    ;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)&sol);
    dVar4 = sin(dVar3);
    V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         -dVar4;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)&V2);
    local_540 = (Matrix<double,_4,_4,_0,_4,_4> *)cos(dVar3);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)&local_540);
    w2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)&w2);
    local_c50 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_c50);
    local_c58 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_c58);
    local_c60 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_c60);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&TV1);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&TV1,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&TV2);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TV2,&TV1,3,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TV2,&V1);
    V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&dir2,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&n2);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)&sol,(double *)&V2,(StorageBaseType *)&n2);
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&dir2;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::normalized(&w2,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                      *)&TV2);
    dVar3 = atan2(w2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1],w2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                           .m_data.array[0]);
    V2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         cos(dVar3);
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0
    ;
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         4.94065645841247e-324;
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         4.94065645841247e-324;
    TV2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)&V2;
    sol.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         sin(dVar3);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&TV2,
                        (Scalar *)&sol);
    local_540 = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)&local_540);
    local_c50 = sin(dVar3);
    local_c50 = -local_c50;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_c50);
    local_c58 = cos(dVar3);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_c58);
    local_c60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_c60);
    local_918 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_918);
    local_920 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_920);
    local_928 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_928);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&TV2);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&TV2,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)&sol);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&sol,&TV2,3,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&sol,&V2);
    local_540 = &TU2;
    local_538 = &Tu2;
    local_520 = &Tu1;
    local_518 = &TU1;
    local_530 = &TV2;
    local_528 = &TV1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&sol,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                *)&local_540);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,&sol);
    std::
    _Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_c00);
  }
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&lines1.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}